

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_relocate(Tree *this,substr next_arena)

{
  pfn_error p_Var1;
  NodeData *pNVar2;
  size_t sVar3;
  Location LVar4;
  Location LVar5;
  substr next_arena_00;
  substr next_arena_01;
  substr next_arena_02;
  substr next_arena_03;
  substr next_arena_04;
  substr next_arena_05;
  substr next_arena_06;
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  csubstr s_02;
  csubstr s_03;
  csubstr s_04;
  csubstr s_05;
  csubstr s_06;
  csubstr s_07;
  csubstr s_08;
  bool bVar6;
  error_flags eVar7;
  ulong in_RDX;
  void *in_RSI;
  Tree *in_RDI;
  substr sVar8;
  ro_substr rVar9;
  TagDirective *td;
  TagDirective *__end2;
  TagDirective *__begin2;
  TagDirective (*__range2) [4];
  NodeData *e;
  NodeData *n;
  char msg_1 [46];
  char msg [39];
  size_t in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  size_t in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  Location *in_stack_fffffffffffffc40;
  NodeData *local_350;
  size_t local_348;
  char *local_300;
  size_t local_2f8;
  Tree *local_2d0;
  char *local_290;
  size_t local_288;
  Tree *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  char *local_1f0;
  size_t local_1e8;
  char *local_1a0;
  size_t local_198;
  char *local_150;
  size_t local_148;
  char *local_100;
  size_t local_f8;
  NodeData *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  size_t local_b0;
  char local_a8 [56];
  undefined8 local_70;
  size_t sStack_68;
  size_t local_60;
  size_t sStack_58;
  char *local_50;
  char local_48 [48];
  void *local_18;
  ulong local_10;
  void **local_8;
  
  local_8 = &local_18;
  local_18 = in_RSI;
  local_10 = in_RDX;
  if (in_RDX == 0 || in_RSI == (void *)0x0) {
    memcpy(local_48,"check failed: (next_arena.not_empty())",0x27);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_callbacks).m_error;
    Location::Location(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30
                       ,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    LVar4.super_LineCol.line = sStack_68;
    LVar4.super_LineCol.offset = local_70;
    LVar4.super_LineCol.col = local_60;
    LVar4.name.str = (char *)sStack_58;
    LVar4.name.len = (size_t)local_50;
    (*p_Var1)(local_48,0x27,LVar4,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffc20 = sStack_68;
    in_stack_fffffffffffffc28 = local_60;
    in_stack_fffffffffffffc30 = sStack_58;
    in_stack_fffffffffffffc38 = local_50;
  }
  if (local_10 < (in_RDI->m_arena).len) {
    memcpy(local_a8,"check failed: (next_arena.len >= m_arena.len)",0x2e);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_callbacks).m_error;
    Location::Location(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30
                       ,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    LVar5.super_LineCol.line = uStack_c8;
    LVar5.super_LineCol.offset = local_d0;
    LVar5.super_LineCol.col = local_c0;
    LVar5.name.str = (char *)uStack_b8;
    LVar5.name.len = local_b0;
    (*p_Var1)(local_a8,0x2e,LVar5,(in_RDI->m_callbacks).m_user_data);
  }
  memcpy(local_18,(in_RDI->m_arena).str,in_RDI->m_arena_pos);
  pNVar2 = in_RDI->m_buf;
  sVar3 = in_RDI->m_cap;
  for (local_d8 = in_RDI->m_buf; local_d8 != pNVar2 + sVar3; local_d8 = local_d8 + 1) {
    bVar6 = in_arena(in_RDI,(local_d8->m_key).scalar);
    if (bVar6) {
      s.len = (size_t)in_stack_fffffffffffffdd0;
      s.str = in_stack_fffffffffffffdc8;
      sVar8.len = (size_t)in_stack_fffffffffffffdc0;
      sVar8.str = in_stack_fffffffffffffdb8;
      _relocated(in_stack_fffffffffffffdb0,s,sVar8);
      rVar9 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2e4887);
      local_100 = rVar9.str;
      (local_d8->m_key).scalar.str = local_100;
      local_f8 = rVar9.len;
      (local_d8->m_key).scalar.len = local_f8;
    }
    bVar6 = in_arena(in_RDI,(local_d8->m_key).tag);
    if (bVar6) {
      s_00.len = (size_t)in_stack_fffffffffffffdd0;
      s_00.str = in_stack_fffffffffffffdc8;
      next_arena_00.len = (size_t)in_stack_fffffffffffffdc0;
      next_arena_00.str = in_stack_fffffffffffffdb8;
      _relocated(in_stack_fffffffffffffdb0,s_00,next_arena_00);
      rVar9 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2e4981);
      local_150 = rVar9.str;
      (local_d8->m_key).tag.str = local_150;
      local_148 = rVar9.len;
      (local_d8->m_key).tag.len = local_148;
    }
    bVar6 = in_arena(in_RDI,(local_d8->m_key).anchor);
    if (bVar6) {
      s_01.len = (size_t)in_stack_fffffffffffffdd0;
      s_01.str = in_stack_fffffffffffffdc8;
      next_arena_01.len = (size_t)in_stack_fffffffffffffdc0;
      next_arena_01.str = in_stack_fffffffffffffdb8;
      _relocated(in_stack_fffffffffffffdb0,s_01,next_arena_01);
      rVar9 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2e4a7b);
      local_1a0 = rVar9.str;
      (local_d8->m_key).anchor.str = local_1a0;
      local_198 = rVar9.len;
      (local_d8->m_key).anchor.len = local_198;
    }
    bVar6 = in_arena(in_RDI,(local_d8->m_val).scalar);
    if (bVar6) {
      s_02.len = (size_t)in_stack_fffffffffffffdd0;
      s_02.str = in_stack_fffffffffffffdc8;
      next_arena_02.len = (size_t)in_stack_fffffffffffffdc0;
      next_arena_02.str = in_stack_fffffffffffffdb8;
      _relocated(in_stack_fffffffffffffdb0,s_02,next_arena_02);
      rVar9 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2e4b75);
      local_1f0 = rVar9.str;
      (local_d8->m_val).scalar.str = local_1f0;
      local_1e8 = rVar9.len;
      (local_d8->m_val).scalar.len = local_1e8;
    }
    in_stack_fffffffffffffdd0 = (local_d8->m_val).tag.str;
    bVar6 = in_arena(in_RDI,(local_d8->m_val).tag);
    if (bVar6) {
      s_03.len = (size_t)in_stack_fffffffffffffdd0;
      s_03.str = in_stack_fffffffffffffdc8;
      next_arena_03.len = (size_t)in_stack_fffffffffffffdc0;
      next_arena_03.str = in_stack_fffffffffffffdb8;
      sVar8 = _relocated(in_stack_fffffffffffffdb0,s_03,next_arena_03);
      in_stack_fffffffffffffdb0 = (Tree *)sVar8.str;
      in_stack_fffffffffffffdb8 = (char *)sVar8.len;
      rVar9 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2e4c6f);
      in_stack_fffffffffffffdc0 = rVar9.str;
      in_stack_fffffffffffffdc8 = (char *)rVar9.len;
      (local_d8->m_val).tag.str = in_stack_fffffffffffffdc0;
      (local_d8->m_val).tag.len = (size_t)in_stack_fffffffffffffdc8;
    }
    bVar6 = in_arena(in_RDI,(local_d8->m_val).anchor);
    if (bVar6) {
      s_04.len = (size_t)in_stack_fffffffffffffdd0;
      s_04.str = in_stack_fffffffffffffdc8;
      next_arena_04.len = (size_t)in_stack_fffffffffffffdc0;
      next_arena_04.str = in_stack_fffffffffffffdb8;
      _relocated(in_stack_fffffffffffffdb0,s_04,next_arena_04);
      rVar9 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2e4d69);
      local_290 = rVar9.str;
      (local_d8->m_val).anchor.str = local_290;
      local_288 = rVar9.len;
      (local_d8->m_val).anchor.len = local_288;
    }
  }
  for (local_2d0 = (Tree *)in_RDI->m_tag_directives; local_2d0 != in_RDI + 1;
      local_2d0 = (Tree *)&local_2d0->m_arena) {
    s_07.str = (char *)local_2d0->m_size;
    s_07.len = local_2d0->m_free_head;
    bVar6 = in_arena(in_RDI,s_07);
    if (bVar6) {
      s_05.len = (size_t)in_stack_fffffffffffffdd0;
      s_05.str = in_stack_fffffffffffffdc8;
      next_arena_05.len = (size_t)in_stack_fffffffffffffdc0;
      next_arena_05.str = in_stack_fffffffffffffdb8;
      _relocated(in_stack_fffffffffffffdb0,s_05,next_arena_05);
      rVar9 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2e4edd);
      local_300 = rVar9.str;
      local_2d0->m_size = (size_t)local_300;
      local_2f8 = rVar9.len;
      local_2d0->m_free_head = local_2f8;
    }
    s_08.str = (char *)local_2d0->m_buf;
    s_08.len = local_2d0->m_cap;
    bVar6 = in_arena(in_RDI,s_08);
    if (bVar6) {
      s_06.len = (size_t)in_stack_fffffffffffffdd0;
      s_06.str = in_stack_fffffffffffffdc8;
      next_arena_06.len = (size_t)in_stack_fffffffffffffdc0;
      next_arena_06.str = in_stack_fffffffffffffdb8;
      _relocated(in_stack_fffffffffffffdb0,s_06,next_arena_06);
      rVar9 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2e4fc3);
      local_350 = (NodeData *)rVar9.str;
      local_2d0->m_buf = local_350;
      local_348 = rVar9.len;
      local_2d0->m_cap = local_348;
    }
  }
  return;
}

Assistant:

void Tree::_relocate(substr next_arena)
{
    _RYML_CB_ASSERT(m_callbacks, next_arena.not_empty());
    _RYML_CB_ASSERT(m_callbacks, next_arena.len >= m_arena.len);
    memcpy(next_arena.str, m_arena.str, m_arena_pos);
    for(NodeData *C4_RESTRICT n = m_buf, *e = m_buf + m_cap; n != e; ++n)
    {
        if(in_arena(n->m_key.scalar))
            n->m_key.scalar = _relocated(n->m_key.scalar, next_arena);
        if(in_arena(n->m_key.tag))
            n->m_key.tag = _relocated(n->m_key.tag, next_arena);
        if(in_arena(n->m_key.anchor))
            n->m_key.anchor = _relocated(n->m_key.anchor, next_arena);
        if(in_arena(n->m_val.scalar))
            n->m_val.scalar = _relocated(n->m_val.scalar, next_arena);
        if(in_arena(n->m_val.tag))
            n->m_val.tag = _relocated(n->m_val.tag, next_arena);
        if(in_arena(n->m_val.anchor))
            n->m_val.anchor = _relocated(n->m_val.anchor, next_arena);
    }
    for(TagDirective &C4_RESTRICT td : m_tag_directives)
    {
        if(in_arena(td.prefix))
            td.prefix = _relocated(td.prefix, next_arena);
        if(in_arena(td.handle))
            td.handle = _relocated(td.handle, next_arena);
    }
}